

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_vui_parameters(sps_t *sps,bs_t *b)

{
  uint32_t uVar1;
  FILE *pFVar2;
  
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).aspect_ratio_info_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.aspect_ratio_info_present_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).aspect_ratio_info_present_flag != 0) {
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u8(b);
    (sps->vui).aspect_ratio_idc = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.aspect_ratio_idc: %d \n",(ulong)uVar1);
    if ((sps->vui).aspect_ratio_idc == 0xff) {
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u(b,0x10);
      (sps->vui).sar_width = uVar1;
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"sps->vui.sar_width: %d \n",(ulong)uVar1);
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u(b,0x10);
      (sps->vui).sar_height = uVar1;
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"sps->vui.sar_height: %d \n",(ulong)uVar1);
    }
  }
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).overscan_info_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.overscan_info_present_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).overscan_info_present_flag != 0) {
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).overscan_appropriate_flag = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.overscan_appropriate_flag: %d \n",(ulong)uVar1);
  }
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).video_signal_type_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.video_signal_type_present_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).video_signal_type_present_flag != 0) {
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u(b,3);
    (sps->vui).video_format = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.video_format: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).video_full_range_flag = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.video_full_range_flag: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).colour_description_present_flag = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.colour_description_present_flag: %d \n",(ulong)uVar1);
    if ((sps->vui).colour_description_present_flag != 0) {
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u8(b);
      (sps->vui).colour_primaries = uVar1;
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"sps->vui.colour_primaries: %d \n",(ulong)uVar1);
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u8(b);
      (sps->vui).transfer_characteristics = uVar1;
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"sps->vui.transfer_characteristics: %d \n",(ulong)uVar1);
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u8(b);
      (sps->vui).matrix_coefficients = uVar1;
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"sps->vui.matrix_coefficients: %d \n",(ulong)uVar1);
    }
  }
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).chroma_loc_info_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.chroma_loc_info_present_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).chroma_loc_info_present_flag != 0) {
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).chroma_sample_loc_type_top_field = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.chroma_sample_loc_type_top_field: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).chroma_sample_loc_type_bottom_field = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.chroma_sample_loc_type_bottom_field: %d \n",(ulong)uVar1);
  }
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).timing_info_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.timing_info_present_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).timing_info_present_flag != 0) {
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u(b,0x20);
    (sps->vui).num_units_in_tick = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.num_units_in_tick: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u(b,0x20);
    (sps->vui).time_scale = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.time_scale: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).fixed_frame_rate_flag = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.fixed_frame_rate_flag: %d \n",(ulong)uVar1);
  }
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).nal_hrd_parameters_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.nal_hrd_parameters_present_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).nal_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_nal,b);
  }
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).vcl_hrd_parameters_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.vcl_hrd_parameters_present_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).vcl_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_vcl,b);
  }
  if (((sps->vui).nal_hrd_parameters_present_flag != 0) ||
     ((sps->vui).vcl_hrd_parameters_present_flag != 0)) {
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).low_delay_hrd_flag = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.low_delay_hrd_flag: %d \n",(ulong)uVar1);
  }
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).pic_struct_present_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.pic_struct_present_flag: %d \n",(ulong)uVar1);
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).bitstream_restriction_flag = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"sps->vui.bitstream_restriction_flag: %d \n",(ulong)uVar1);
  if ((sps->vui).bitstream_restriction_flag != 0) {
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).motion_vectors_over_pic_boundaries_flag = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).max_bytes_per_pic_denom = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.max_bytes_per_pic_denom: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).max_bits_per_mb_denom = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.max_bits_per_mb_denom: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).log2_max_mv_length_horizontal = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.log2_max_mv_length_horizontal: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).log2_max_mv_length_vertical = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.log2_max_mv_length_vertical: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).num_reorder_frames = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.num_reorder_frames: %d \n",(ulong)uVar1);
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).max_dec_frame_buffering = uVar1;
    pFVar2 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"sps->vui.max_dec_frame_buffering: %d \n",(ulong)uVar1);
    return;
  }
  return;
}

Assistant:

void read_debug_vui_parameters(sps_t* sps, bs_t* b)
{
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_info_present_flag = bs_read_u1(b); printf("sps->vui.aspect_ratio_info_present_flag: %d \n", sps->vui.aspect_ratio_info_present_flag); 
    if( sps->vui.aspect_ratio_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_idc = bs_read_u8(b); printf("sps->vui.aspect_ratio_idc: %d \n", sps->vui.aspect_ratio_idc); 
        if( sps->vui.aspect_ratio_idc == SAR_Extended )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_width = bs_read_u(b, 16); printf("sps->vui.sar_width: %d \n", sps->vui.sar_width); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_height = bs_read_u(b, 16); printf("sps->vui.sar_height: %d \n", sps->vui.sar_height); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_info_present_flag = bs_read_u1(b); printf("sps->vui.overscan_info_present_flag: %d \n", sps->vui.overscan_info_present_flag); 
    if( sps->vui.overscan_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_appropriate_flag = bs_read_u1(b); printf("sps->vui.overscan_appropriate_flag: %d \n", sps->vui.overscan_appropriate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_signal_type_present_flag = bs_read_u1(b); printf("sps->vui.video_signal_type_present_flag: %d \n", sps->vui.video_signal_type_present_flag); 
    if( sps->vui.video_signal_type_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_format = bs_read_u(b, 3); printf("sps->vui.video_format: %d \n", sps->vui.video_format); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_full_range_flag = bs_read_u1(b); printf("sps->vui.video_full_range_flag: %d \n", sps->vui.video_full_range_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_description_present_flag = bs_read_u1(b); printf("sps->vui.colour_description_present_flag: %d \n", sps->vui.colour_description_present_flag); 
        if( sps->vui.colour_description_present_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_primaries = bs_read_u8(b); printf("sps->vui.colour_primaries: %d \n", sps->vui.colour_primaries); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.transfer_characteristics = bs_read_u8(b); printf("sps->vui.transfer_characteristics: %d \n", sps->vui.transfer_characteristics); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.matrix_coefficients = bs_read_u8(b); printf("sps->vui.matrix_coefficients: %d \n", sps->vui.matrix_coefficients); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_loc_info_present_flag = bs_read_u1(b); printf("sps->vui.chroma_loc_info_present_flag: %d \n", sps->vui.chroma_loc_info_present_flag); 
    if( sps->vui.chroma_loc_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_top_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_top_field: %d \n", sps->vui.chroma_sample_loc_type_top_field); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_bottom_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_bottom_field: %d \n", sps->vui.chroma_sample_loc_type_bottom_field); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.timing_info_present_flag = bs_read_u1(b); printf("sps->vui.timing_info_present_flag: %d \n", sps->vui.timing_info_present_flag); 
    if( sps->vui.timing_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_units_in_tick = bs_read_u(b, 32); printf("sps->vui.num_units_in_tick: %d \n", sps->vui.num_units_in_tick); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.time_scale = bs_read_u(b, 32); printf("sps->vui.time_scale: %d \n", sps->vui.time_scale); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.fixed_frame_rate_flag = bs_read_u1(b); printf("sps->vui.fixed_frame_rate_flag: %d \n", sps->vui.fixed_frame_rate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.nal_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.nal_hrd_parameters_present_flag: %d \n", sps->vui.nal_hrd_parameters_present_flag); 
    if( sps->vui.nal_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_nal, b);
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.vcl_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.vcl_hrd_parameters_present_flag: %d \n", sps->vui.vcl_hrd_parameters_present_flag); 
    if( sps->vui.vcl_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_vcl, b);
    }
    if( sps->vui.nal_hrd_parameters_present_flag || sps->vui.vcl_hrd_parameters_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.low_delay_hrd_flag = bs_read_u1(b); printf("sps->vui.low_delay_hrd_flag: %d \n", sps->vui.low_delay_hrd_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.pic_struct_present_flag = bs_read_u1(b); printf("sps->vui.pic_struct_present_flag: %d \n", sps->vui.pic_struct_present_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.bitstream_restriction_flag = bs_read_u1(b); printf("sps->vui.bitstream_restriction_flag: %d \n", sps->vui.bitstream_restriction_flag); 
    if( sps->vui.bitstream_restriction_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.motion_vectors_over_pic_boundaries_flag = bs_read_u1(b); printf("sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n", sps->vui.motion_vectors_over_pic_boundaries_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bytes_per_pic_denom = bs_read_ue(b); printf("sps->vui.max_bytes_per_pic_denom: %d \n", sps->vui.max_bytes_per_pic_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bits_per_mb_denom = bs_read_ue(b); printf("sps->vui.max_bits_per_mb_denom: %d \n", sps->vui.max_bits_per_mb_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_horizontal = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_horizontal: %d \n", sps->vui.log2_max_mv_length_horizontal); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_vertical = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_vertical: %d \n", sps->vui.log2_max_mv_length_vertical); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_reorder_frames = bs_read_ue(b); printf("sps->vui.num_reorder_frames: %d \n", sps->vui.num_reorder_frames); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_dec_frame_buffering = bs_read_ue(b); printf("sps->vui.max_dec_frame_buffering: %d \n", sps->vui.max_dec_frame_buffering); 
    }
}